

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void print_node3(Abc_Obj_t *pObj)

{
  Flow_Data_t *pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char local_26 [6];
  Abc_Obj_t *pAStack_20;
  char m [6];
  Abc_Obj_t *pNext;
  int i;
  Abc_Obj_t *pObj_local;
  
  local_26[0] = '\0';
  if ((*(uint *)&pObj->field_0x14 >> 4 & 1) != 0) {
    strcat(local_26,"A");
  }
  if ((*(uint *)&pObj->field_0x14 >> 5 & 1) != 0) {
    strcat(local_26,"B");
  }
  if ((*(uint *)&pObj->field_0x14 >> 6 & 1) != 0) {
    strcat(local_26,"C");
  }
  uVar2 = Abc_ObjId(pObj);
  uVar3 = Abc_ObjType(pObj);
  pFVar1 = pManMR->pDataArray;
  uVar4 = Abc_ObjId(pObj);
  printf("\nnode %d type=%d mark=%d %s\n",(ulong)uVar2,(ulong)uVar3,
         (ulong)*(ushort *)(pFVar1 + uVar4),local_26);
  printf("fanouts\n");
  for (pNext._4_4_ = 0; iVar5 = Abc_ObjFanoutNum(pObj), pNext._4_4_ < iVar5;
      pNext._4_4_ = pNext._4_4_ + 1) {
    pAStack_20 = Abc_ObjFanout(pObj,pNext._4_4_);
    print_node(pAStack_20);
    printf("\n");
  }
  printf("fanins\n");
  for (pNext._4_4_ = 0; iVar5 = Abc_ObjFaninNum(pObj), pNext._4_4_ < iVar5;
      pNext._4_4_ = pNext._4_4_ + 1) {
    pAStack_20 = Abc_ObjFanin(pObj,pNext._4_4_);
    print_node(pAStack_20);
    printf("\n");
  }
  return;
}

Assistant:

void
print_node3(Abc_Obj_t *pObj) {
  int i;
  Abc_Obj_t * pNext;
  char m[6];

  m[0] = 0;
  if (pObj->fMarkA)
    strcat(m, "A");
  if (pObj->fMarkB)
    strcat(m, "B");
  if (pObj->fMarkC)
    strcat(m, "C");

  printf("\nnode %d type=%d mark=%d %s\n", Abc_ObjId(pObj), Abc_ObjType(pObj), FDATA(pObj)->mark, m);
  printf("fanouts\n");
  Abc_ObjForEachFanout( pObj, pNext, i ) {
    print_node(pNext);
    printf("\n");
  }
  printf("fanins\n");
  Abc_ObjForEachFanin( pObj, pNext, i ) {
    print_node(pNext);
    printf("\n");
  }
}